

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rule_test.cpp
# Opt level: O0

void __thiscall
jhu::thrax::RuleTests_numSourceTokensLex_Test::TestBody(RuleTests_numSourceTokensLex_Test *this)

{
  bool bVar1;
  char *message;
  char *in_RCX;
  string_view line;
  AssertHelper local_128;
  Message local_120;
  int local_118 [2];
  undefined1 local_110 [8];
  AssertionResult gtest_ar;
  undefined1 local_f0 [8];
  PhrasalRule rule;
  size_t local_60;
  undefined1 local_58 [8];
  AlignedSentencePair asp;
  RuleTests_numSourceTokensLex_Test *this_local;
  
  asp.alignment.super__Vector_base<jhu::thrax::Point,_std::allocator<jhu::thrax::Point>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)this;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)&rule.sentence,
             "a c e\tb d f\t0-0 1-1 2-2");
  line._M_str = in_RCX;
  line._M_len = local_60;
  readAlignedSentencePair<false,false>((AlignedSentencePair *)local_58,(thrax *)rule.sentence,line);
  PhrasalRule::PhrasalRule((PhrasalRule *)local_f0,(AlignedSentencePair *)local_58);
  local_118[1] = 3;
  local_118[0] = PhrasalRule::numTokens<true>((PhrasalRule *)local_f0);
  testing::internal::EqHelper<false>::Compare<int,int>
            ((EqHelper<false> *)local_110,"3","rule.numTokens<true>()",local_118 + 1,local_118);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_110);
  if (!bVar1) {
    testing::Message::Message(&local_120);
    message = testing::AssertionResult::failure_message((AssertionResult *)local_110);
    testing::internal::AssertHelper::AssertHelper
              (&local_128,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jweese[P]thrax2/test/rule_test.cpp"
               ,0x2a,message);
    testing::internal::AssertHelper::operator=(&local_128,&local_120);
    testing::internal::AssertHelper::~AssertHelper(&local_128);
    testing::Message::~Message(&local_120);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_110);
  AlignedSentencePair::~AlignedSentencePair((AlignedSentencePair *)local_58);
  return;
}

Assistant:

TEST(RuleTests, numSourceTokensLex) {
  auto asp = readAlignedSentencePair<false, false>("a c e\tb d f\t0-0 1-1 2-2");
  PhrasalRule rule{asp};
  EXPECT_EQ(3, rule.numTokens<true>());
}